

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O1

string * __thiscall
iuRenameParamTest::MakeTestParamName_abi_cxx11_
          (string *__return_storage_ptr__,iuRenameParamTest *this,TestParamInfo<bool> *info)

{
  undefined1 local_1a0 [392];
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(bool *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  return __return_storage_ptr__;
}

Assistant:

static const ::std::string MakeTestParamName(const iutest::TestParamInfo<bool>& info)
    {
        return ::iutest::StreamableToString(info.param);
    }